

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

int L3_restore_reservoir(mp3dec_t *h,bs_t *bs,mp3dec_scratch_t *s,int main_data_begin)

{
  int iVar1;
  int in_ECX;
  bs_t *in_RDX;
  long *in_RSI;
  long in_RDI;
  int bytes_have;
  int frame_bytes;
  int local_4c;
  int local_3c;
  int local_28;
  
  iVar1 = (*(int *)((long)in_RSI + 0xc) - (int)in_RSI[1]) / 8;
  local_28 = in_ECX;
  if (*(int *)(in_RDI + 0x1800) <= in_ECX) {
    local_28 = *(int *)(in_RDI + 0x1800);
  }
  if (*(int *)(in_RDI + 0x1800) - in_ECX < 1) {
    local_3c = 0;
  }
  else {
    local_3c = *(int *)(in_RDI + 0x1800) - in_ECX;
  }
  local_4c = in_ECX;
  if (*(int *)(in_RDI + 0x1800) <= in_ECX) {
    local_4c = *(int *)(in_RDI + 0x1800);
  }
  memcpy(in_RDX + 1,(void *)(in_RDI + 0x180c + (long)local_3c),(long)local_4c);
  memcpy((void *)((long)&in_RDX[1].buf + (long)local_28),
         (void *)(*in_RSI + (long)((int)in_RSI[1] / 8)),(long)iVar1);
  bs_init(in_RDX,(uint8_t *)(in_RDX + 1),local_28 + iVar1);
  return (int)(in_ECX <= *(int *)(in_RDI + 0x1800));
}

Assistant:

static int L3_restore_reservoir(mp3dec_t *h, bs_t *bs, mp3dec_scratch_t *s, int main_data_begin)
{
    int frame_bytes = (bs->limit - bs->pos)/8;
    int bytes_have = MINIMP3_MIN(h->reserv, main_data_begin);
    memcpy(s->maindata, h->reserv_buf + MINIMP3_MAX(0, h->reserv - main_data_begin), MINIMP3_MIN(h->reserv, main_data_begin));
    memcpy(s->maindata + bytes_have, bs->buf + bs->pos/8, frame_bytes);
    bs_init(&s->bs, s->maindata, bytes_have + frame_bytes);
    return h->reserv >= main_data_begin;
}